

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void __thiscall
Symbol::SetHasFuncAssignmentInternal(Symbol *this,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  FuncInfo *pFVar4;
  CharacterBuffer<char16_t> *this_00;
  char16_t *pcVar5;
  Scope *pSVar6;
  char16_t *local_40;
  FuncInfo *top;
  ByteCodeGenerator *byteCodeGenerator_local;
  Symbol *this_local;
  
  if ((this->hasFuncAssignment & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x9b,"(!hasFuncAssignment)","!hasFuncAssignment");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->hasFuncAssignment = true;
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&pFVar4->byteCodeFunction->super_FunctionProxy);
  functionId = Js::FunctionProxy::GetLocalFunctionId(&pFVar4->byteCodeFunction->super_FunctionProxy)
  ;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,sourceContextId,functionId);
  if (bVar2) {
    this_00 = GetName(this);
    pcVar5 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_00);
    Output::Print(L"HasFuncAssignment: %s\n",pcVar5);
    Output::Flush();
  }
  bVar2 = GetHasMaybeEscapedUse(this);
  if (!bVar2) {
    pSVar6 = GetScope(this);
    bVar2 = Scope::GetIsObject(pSVar6);
    if (!bVar2) {
      return;
    }
  }
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  bVar2 = GetIsFormal(this);
  if (bVar2) {
    local_40 = L"FormalAssignment";
  }
  else {
    pSVar6 = GetScope(this);
    bVar2 = Scope::GetIsObject(pSVar6);
    local_40 = L"MaybeEscapedUse";
    if (bVar2) {
      local_40 = L"ObjectScopeAssignment";
    }
  }
  FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar4,local_40);
  return;
}

Assistant:

void Symbol::SetHasFuncAssignmentInternal(ByteCodeGenerator * byteCodeGenerator)
{
    Assert(!hasFuncAssignment);
    hasFuncAssignment = true;
    FuncInfo * top = byteCodeGenerator->TopFuncInfo();
    if (PHASE_TESTTRACE(Js::StackFuncPhase, top->byteCodeFunction))
    {
        Output::Print(_u("HasFuncAssignment: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }

    if (this->GetHasMaybeEscapedUse() || this->GetScope()->GetIsObject())
    {
        byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(
            this->GetIsFormal() ? _u("FormalAssignment") :
            this->GetScope()->GetIsObject() ? _u("ObjectScopeAssignment") :
            _u("MaybeEscapedUse")));
    }
}